

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uTimer.cpp
# Opt level: O2

void __thiscall UTimer::~UTimer(UTimer *this)

{
  long lVar1;
  ostream *poVar2;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  (this->stop).__d.__r = lVar1;
  (this->elapsedTime).__r = (double)(lVar1 - (this->start).__d.__r) / 1000000000.0;
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->message);
  poVar2 = std::operator<<(poVar2," computed in ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2," usec  (");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2," milliseconds)");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&this->message);
  return;
}

Assistant:

UTimer::~UTimer () {
	stop		= std::chrono::high_resolution_clock::now();
	elapsedTime	= stop - start;
	auto usec	= std::chrono::duration_cast<usecs>(elapsedTime).count();
	auto msec	= std::chrono::duration_cast<msecs>(elapsedTime).count();
	
	std::cout << message << " computed in " << usec << " usec  (" << msec << " milliseconds)" << std::endl;
}